

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::CombinedImageSamplerHandler::CombinedImageSamplerHandler
          (CombinedImageSamplerHandler *this,Compiler *compiler_)

{
  (this->super_OpcodeHandler)._vptr_OpcodeHandler =
       (_func_int **)&PTR__CombinedImageSamplerHandler_008998a0;
  this->compiler = compiler_;
  ::std::
  stack<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>,std::deque<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>,std::allocator<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>>>
  ::
  stack<std::deque<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>,std::allocator<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>>,void>
            (&this->parameter_remapping);
  ::std::
  stack<diligent_spirv_cross::SPIRFunction*,std::deque<diligent_spirv_cross::SPIRFunction*,std::allocator<diligent_spirv_cross::SPIRFunction*>>>
  ::
  stack<std::deque<diligent_spirv_cross::SPIRFunction*,std::allocator<diligent_spirv_cross::SPIRFunction*>>,void>
            (&this->functions);
  return;
}

Assistant:

CombinedImageSamplerHandler(Compiler &compiler_)
		    : compiler(compiler_)
		{
		}